

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_members_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_MembersTest_::
SimpleFunctions<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_std::mutex>_>
::TestBody(SimpleFunctions<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  long lVar1;
  char *message;
  AssertHelper aAStack_770 [10];
  internal local_720 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_718;
  undefined8 uStack_710;
  __native_type local_708 [44];
  
  lVar1 = 0x68;
  do {
    *(undefined8 *)((long)&aAStack_770[6].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[7].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[4].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[5].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[2].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[3].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[0].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[1].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_770[8].data_ + lVar1) = 0;
    *(undefined8 *)(local_720 + lVar1) = 0;
    *(long *)((long)&local_718 + lVar1) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)&uStack_710 + lVar1) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)local_708 + lVar1) = 0;
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0x768);
  aAStack_770[9].data_ = (AssertHelperData *)0xffffffffffffffff;
  uStack_710._4_4_ = 0;
  aAStack_770[8].data_ = (AssertHelperData *)0x208034;
  testing::internal::CmpHelperGT<unsigned_long,int>
            (local_720,"TypeParam().max_size()","0",(unsigned_long *)(aAStack_770 + 9),
             (int *)((long)&uStack_710 + 4));
  aAStack_770[8].data_ = (AssertHelperData *)0x20803e;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_708[0].__data);
  if (local_720[0] == (internal)0x0) {
    aAStack_770[8].data_ = (AssertHelperData *)0x20804f;
    testing::Message::Message((Message *)&local_708[0].__data);
    if (local_718 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_718->_M_dataplus)._M_p;
    }
    aAStack_770[8].data_ = (AssertHelperData *)0x20807e;
    testing::internal::AssertHelper::AssertHelper
              (aAStack_770 + 9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x4f,message);
    aAStack_770[8].data_ = (AssertHelperData *)0x20808b;
    testing::internal::AssertHelper::operator=(aAStack_770 + 9,(Message *)&local_708[0].__data);
    aAStack_770[8].data_ = (AssertHelperData *)0x208093;
    testing::internal::AssertHelper::~AssertHelper(aAStack_770 + 9);
    if ((long *)local_708[0]._0_8_ != (long *)0x0) {
      aAStack_770[8].data_ = (AssertHelperData *)0x2080a3;
      (**(code **)(*(long *)local_708[0]._0_8_ + 8))();
    }
  }
  if (local_718 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    aAStack_770[8].data_ = (AssertHelperData *)0x2080b7;
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_718,local_718);
  }
  return;
}

Assistant:

TYPED_TEST_P(MembersTest, SimpleFunctions) {
  EXPECT_GT(TypeParam().max_size(), 0);
}